

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::MergeScenes
               (aiScene **_dest,vector<aiScene_*,_std::allocator<aiScene_*>_> *src,uint flags)

{
  uint uVar1;
  aiScene *paVar2;
  aiNode *paVar3;
  ulong uVar4;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> srcList;
  allocator_type local_41;
  _Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> local_40;
  
  if (_dest != (aiScene **)0x0) {
    paVar2 = *_dest;
    if (*(undefined8 **)src == *(undefined8 **)(src + 8)) {
      if (paVar2 != (aiScene *)0x0) {
        aiScene::~aiScene(paVar2);
        CopySceneFlat(_dest,(aiScene *)**(undefined8 **)src);
        return;
      }
      *_dest = (aiScene *)**(undefined8 **)src;
    }
    else {
      if (paVar2 == (aiScene *)0x0) {
        paVar2 = (aiScene *)operator_new(0x80);
        aiScene::aiScene(paVar2);
        *_dest = paVar2;
      }
      else {
        aiScene::~aiScene(paVar2);
      }
      paVar2 = (aiScene *)operator_new(0x80);
      aiScene::aiScene(paVar2);
      paVar3 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar3);
      paVar2->mRootNode = paVar3;
      aiString::Set((aiString *)paVar3,"<MergeRoot>");
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::vector
                ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
                 &local_40,*(long *)(src + 8) - *(long *)src >> 3,&local_41);
      uVar1 = 0;
      while( true ) {
        uVar4 = (ulong)uVar1;
        if ((ulong)((long)local_40._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_40._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar4) break;
        paVar3 = paVar2->mRootNode;
        local_40._M_impl.super__Vector_impl_data._M_start[uVar4].scene =
             *(aiScene **)(*(long *)src + uVar4 * 8);
        local_40._M_impl.super__Vector_impl_data._M_start[uVar4].attachToNode = paVar3;
        uVar1 = uVar1 + 1;
      }
      MergeScenes(_dest,paVar2,
                  (vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)
                  &local_40,flags);
      std::_Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
      ~_Vector_base(&local_40);
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeScenes(aiScene** _dest,std::vector<aiScene*>& src, unsigned int flags) {
    if ( nullptr == _dest ) {
        return;
    }

    // if _dest points to NULL allocate a new scene. Otherwise clear the old and reuse it
    if (src.empty()) {
        if (*_dest) {
            (*_dest)->~aiScene();
            SceneCombiner::CopySceneFlat(_dest,src[0]);
        }
        else *_dest = src[0];
        return;
    }
    if (*_dest)(*_dest)->~aiScene();
    else *_dest = new aiScene();

    // Create a dummy scene to serve as master for the others
    aiScene* master = new aiScene();
    master->mRootNode = new aiNode();
    master->mRootNode->mName.Set("<MergeRoot>");

    std::vector<AttachmentInfo> srcList (src.size());
    for (unsigned int i = 0; i < srcList.size();++i)    {
        srcList[i] = AttachmentInfo(src[i],master->mRootNode);
    }

    // 'master' will be deleted afterwards
    MergeScenes (_dest, master, srcList, flags);
}